

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefEq(TranslateToFuzzReader *this,Type type)

{
  Type TVar1;
  Expression *left;
  Expression *right;
  RefEq *pRVar2;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xc4d,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) == 0) {
    TVar1 = getEqReferenceType(this);
    left = make(this,TVar1);
    TVar1 = getEqReferenceType(this);
    right = make(this,TVar1);
    pRVar2 = Builder::makeRefEq(&this->builder,left,right);
    return (Expression *)pRVar2;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xc4e,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeRefEq(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* left = make(getEqReferenceType());
  auto* right = make(getEqReferenceType());
  return builder.makeRefEq(left, right);
}